

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O0

void sha1_ni_digest(ssh_hash *hash,uint8_t *digest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t e;
  __m128i mask;
  __m128i abcd;
  sha1_ni *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  sha1_block_pad((sha1_block *)(hash + -7),(BinarySink *)&hash[-2].binarysink_);
  mask[1] = CONCAT44(*(undefined4 *)&hash[-9].binarysink_,
                     *(undefined4 *)((long)&hash[-9].binarysink_ + 4));
  abcd[0]._0_4_ = *(undefined4 *)((long)&hash[-9].vt + 4);
  abcd[0]._4_4_ = *(undefined4 *)&hash[-9].vt;
  auVar1._8_8_ = abcd[0];
  auVar1._0_8_ = mask[1];
  auVar2._8_8_ = 0xc0d0e0f08090a0b;
  auVar2._0_8_ = 0x405060700010203;
  auVar2 = pshufb(auVar1,auVar2);
  mask[1] = auVar2._0_8_;
  abcd[0] = auVar2._8_8_;
  *(longlong *)digest = mask[1];
  *(longlong *)(digest + 8) = abcd[0];
  PUT_32BIT_MSB_FIRST(digest + 0x10,*(uint32_t *)((long)&hash[-8].binarysink_ + 4));
  return;
}

Assistant:

static void sha1_ni_digest(ssh_hash *hash, uint8_t *digest)
{
    sha1_ni *s = container_of(hash, sha1_ni, hash);

    sha1_block_pad(&s->blk, BinarySink_UPCAST(s));

    /* Rearrange the first vector into its output order */
    __m128i abcd = _mm_shuffle_epi32(s->core[0], 0x1B);

    /* Byte-swap it into the output endianness */
    const __m128i mask = _mm_setr_epi8(3,2,1,0,7,6,5,4,11,10,9,8,15,14,13,12);
    abcd = _mm_shuffle_epi8(abcd, mask);

    /* And store it */
    _mm_storeu_si128((__m128i *)digest, abcd);

    /* Finally, store the leftover word */
    uint32_t e = _mm_extract_epi32(s->core[1], 3);
    PUT_32BIT_MSB_FIRST(digest + 16, e);
}